

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack1to4_int8.h
# Opt level: O0

void ncnn::convolution_pack1to4_int8_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_int8,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i _s0;
  __m128i _sh;
  __m128i _sl;
  __m128i _w;
  __m128i _val;
  int k;
  char *sptr;
  Mat m_2;
  int q;
  char *kptr;
  __m128i _sum0;
  int j_1;
  int i_1;
  int *outptr;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  allocator_type *in_stack_fffffffffffffa10;
  size_type in_stack_fffffffffffffa18;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa20;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  int local_514;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  long local_4e8;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined8 local_4c8;
  int local_4bc;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  long local_498;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined8 local_478;
  ulong *local_470;
  undefined1 local_468 [16];
  int local_450;
  int local_44c;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined4 local_430;
  long local_428;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined8 local_408;
  long local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  reference local_3e0;
  vector<int,_std::allocator<int>_> local_3c0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  int local_390;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  long *local_378;
  long *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_330;
  undefined8 *local_320;
  undefined8 *local_310;
  undefined1 local_305;
  int local_304;
  undefined8 *local_2f8;
  undefined1 local_2d5;
  int local_2d4;
  undefined8 *local_2c8;
  undefined1 local_2a5;
  int local_2a4;
  undefined8 *local_298;
  long local_240;
  undefined4 local_234;
  long local_230;
  ulong *local_228;
  undefined4 local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  long local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  long local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  long local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  undefined4 local_194;
  long local_190;
  undefined4 local_184;
  long local_180;
  undefined4 local_174;
  long local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  ulong uStack_e0;
  undefined1 local_d8 [16];
  ulong local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  int local_9c;
  undefined8 *local_98;
  ushort local_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  allocator_type *paStack_70;
  undefined1 local_68 [16];
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  allocator_type *paStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_390 = *(int *)((long)in_RDI + 0x2c);
  local_394 = (int)in_RDI[7];
  local_398 = *(int *)((long)in_RSI + 0x2c);
  local_39c = (int)in_RSI[6];
  local_3a0 = (int)in_RSI[7];
  local_3a4 = in_ECX * in_R8D;
  local_38c = in_R9D;
  local_388 = in_R8D;
  local_384 = in_ECX;
  local_380 = in_RDX;
  local_378 = in_RSI;
  local_370 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x65332a);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
  std::allocator<int>::~allocator((allocator<int> *)0x653356);
  local_3e0 = std::vector<int,_std::allocator<int>_>::operator[](&local_3c0,0);
  local_3e4 = 0;
  local_3e8 = 0;
  local_3ec = local_390 * in_stack_00000008 - local_384 * local_38c;
  for (local_3f0 = 0; local_3f0 < local_388; local_3f0 = local_3f0 + 1) {
    for (local_3f4 = 0; local_3f4 < local_384; local_3f4 = local_3f4 + 1) {
      local_3e0[local_3e4] = local_3e8;
      local_3e4 = local_3e4 + 1;
      local_3e8 = local_38c + local_3e8;
    }
    local_3e8 = local_3ec + local_3e8;
  }
  for (local_3f8 = 0; local_3f8 < local_3a0; local_3f8 = local_3f8 + 1) {
    local_2f8 = &local_448;
    local_1a4 = *(int *)((long)local_378 + 0x2c);
    local_1a8 = (int)local_378[6];
    local_1ac = *(undefined4 *)((long)local_378 + 0x34);
    local_1b8 = *local_378 + local_378[8] * (long)local_3f8 * local_378[2];
    local_1c0 = local_378[2];
    local_1c4 = (undefined4)local_378[3];
    local_1d0 = local_378[4];
    local_1a0 = &local_448;
    local_190 = (long)local_1a4 * (long)local_1a8 * local_1c0;
    local_120 = &local_448;
    local_368 = &local_448;
    local_194 = 0x10;
    local_304 = local_3f8;
    local_305 = 1;
    local_448 = 0;
    local_438 = 0;
    local_430 = 0;
    local_420 = 0;
    local_41c = 0;
    local_418 = 0;
    local_414 = 0;
    local_410 = 0;
    local_408 = 0;
    local_440 = 0;
    local_400 = local_1b8;
    for (local_44c = 0; local_44c < local_39c; local_44c = local_44c + 1) {
      for (local_450 = 0; local_450 < local_398; local_450 = local_450 + 1) {
        local_468 = ZEXT816(0);
        local_298 = &local_4b8;
        local_214 = *(int *)((long)local_380 + 0x2c);
        local_218 = (int)local_380[6];
        local_21c = *(undefined4 *)((long)local_380 + 0x34);
        local_228 = (ulong *)(*local_380 + local_380[8] * (long)local_3f8 * local_380[2]);
        local_230 = local_380[2];
        local_234 = (undefined4)local_380[3];
        local_240 = local_380[4];
        local_210 = &local_4b8;
        local_170 = (long)local_214 * (long)local_218 * local_230;
        local_140 = &local_4b8;
        local_360 = &local_4b8;
        uStack_100 = 0;
        local_108 = 0;
        local_174 = 0x10;
        local_2a4 = local_3f8;
        local_2a5 = 1;
        local_4b8 = 0;
        local_4a8 = 0;
        local_4a0 = 0;
        local_490 = 0;
        local_48c = 0;
        local_488 = 0;
        local_484 = 0;
        local_480 = 0;
        local_478 = 0;
        local_4b0 = 0;
        local_470 = local_228;
        for (local_4bc = 0; local_4bc < local_394; local_4bc = local_4bc + 1) {
          local_2c8 = &local_508;
          local_1dc = *(int *)((long)local_370 + 0x2c);
          local_1e0 = (int)local_370[6];
          local_1e4 = *(undefined4 *)((long)local_370 + 0x34);
          local_1f0 = *local_370 + local_370[8] * (long)local_4bc * local_370[2];
          local_1f8 = local_370[2];
          local_1fc = (undefined4)local_370[3];
          local_208 = local_370[4];
          local_1d8 = &local_508;
          local_180 = (long)local_1dc * (long)local_1e0 * local_1f8;
          local_9c = local_44c * in_stack_00000018;
          local_98 = &local_508;
          for (local_514 = 0; local_514 < local_3a4; local_514 = local_514 + 1) {
            local_8a = (ushort)*(char *)(local_1f0 + (long)local_1dc * (long)local_9c * local_1f8 +
                                         (long)(local_450 * in_stack_00000010) +
                                        (long)local_3e0[local_514]);
            auVar1 = vpinsrw_avx(ZEXT216(local_8a),(uint)local_8a,1);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_8a,2);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_8a,3);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_8a,4);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_8a,5);
            auVar1 = vpinsrw_avx(auVar1,(uint)local_8a,6);
            local_68 = vpinsrw_avx(auVar1,(uint)local_8a,7);
            local_a8 = local_470;
            local_f8 = *local_470;
            uStack_b0 = 0;
            uStack_c0 = 0;
            local_e8 = 0;
            local_118._8_8_ = SUB168(ZEXT816(0),4);
            uStack_e0 = local_118._8_8_;
            uStack_f0 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_118._8_8_;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_f8;
            local_d8 = vpcmpgtb_avx(auVar3 << 0x40,auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_f8;
            auVar1 = vpunpcklbw_avx(auVar2,local_d8);
            local_78 = local_68._0_8_;
            paStack_70 = (allocator_type *)local_68._8_8_;
            local_538 = auVar1._0_8_;
            local_88 = local_538;
            uStack_530 = auVar1._8_8_;
            uStack_80 = uStack_530;
            auVar2 = vpmullw_avx(local_68,auVar1);
            local_38 = local_68._0_8_;
            paStack_30 = (allocator_type *)local_68._8_8_;
            local_48 = local_538;
            uStack_40 = uStack_530;
            auVar1 = vpmulhw_avx(local_68,auVar1);
            local_548 = auVar2._0_8_;
            local_18 = local_548;
            uStack_540 = auVar2._8_8_;
            uStack_10 = uStack_540;
            local_558 = auVar1._0_8_;
            local_28 = local_558;
            uStack_550 = auVar1._8_8_;
            uStack_20 = uStack_550;
            auVar1 = vpunpcklwd_avx(auVar2,auVar1);
            local_158 = local_468._0_8_;
            uStack_150 = local_468._8_8_;
            local_568 = auVar1._0_8_;
            local_168 = local_568;
            uStack_560 = auVar1._8_8_;
            uStack_160 = uStack_560;
            local_468 = vpaddd_avx(local_468,auVar1);
            local_470 = (ulong *)((long)local_470 + 4);
            in_stack_fffffffffffffa10 = (allocator_type *)local_68._8_8_;
            local_118 = ZEXT816(0) << 0x20;
            local_c8 = local_f8;
            local_b8 = local_f8;
            local_58 = local_8a;
            local_56 = local_8a;
            local_54 = local_8a;
            local_52 = local_8a;
            local_50 = local_8a;
            local_4e = local_8a;
            local_4c = local_8a;
            local_4a = local_8a;
          }
          local_358 = &local_508;
          local_184 = 0x10;
          local_2d4 = local_4bc;
          local_2d5 = 1;
          local_508 = 0;
          local_4f8 = 0;
          local_4f0 = 0;
          local_4e0 = 0;
          local_4dc = 0;
          local_4d8 = 0;
          local_4d4 = 0;
          local_4d0 = 0;
          local_4c8 = 0;
          local_500 = 0;
          local_330 = local_358;
          local_4e8 = local_208;
        }
        local_128 = (undefined8 *)(local_400 + (long)(local_450 << 2) * 4);
        local_138 = local_468._0_8_;
        uStack_130 = local_468._8_8_;
        *local_128 = local_468._0_8_;
        local_128[1] = local_468._8_8_;
        local_320 = local_360;
        local_498 = local_240;
      }
      local_400 = local_400 + (long)(local_398 << 2) * 4;
    }
    local_310 = local_368;
    local_428 = local_1d0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
  return;
}

Assistant:

static void convolution_pack1to4_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_int8, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m128i _sum0 = _mm_setzero_si128();

                const signed char* kptr = weight_data_int8.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        __m128i _val = _mm_set1_epi16((short)sptr[space_ofs[k]]);

                        // TODO use _mm_cvtepi8_epi16 on sse4.1
                        __m128i _w = _mm_loadl_epi64((const __m128i*)kptr);
                        _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                        __m128i _sl = _mm_mullo_epi16(_val, _w);
                        __m128i _sh = _mm_mulhi_epi16(_val, _w);
                        __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);

                        _sum0 = _mm_add_epi32(_sum0, _s0);

                        kptr += 4;
                    }
                }

                _mm_storeu_si128((__m128i*)(outptr + j * 4), _sum0);
            }

            outptr += outw * 4;
        }
    }
}